

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void get_min_from_loc(Am_Object *ref_obj,Am_Inter_Location *loc,int *min_left,int *min_top)

{
  bool bVar1;
  Am_Object local_48;
  Am_Object loc_ref;
  int local_38;
  int iStack_34;
  bool as_line;
  int d;
  int c;
  int b;
  int a;
  int *min_top_local;
  int *min_left_local;
  Am_Inter_Location *loc_local;
  Am_Object *ref_obj_local;
  
  _b = min_top;
  min_top_local = min_left;
  min_left_local = (int *)loc;
  loc_local = (Am_Inter_Location *)ref_obj;
  Am_Object::Am_Object(&local_48);
  Am_Inter_Location::Get_Location
            ((Am_Inter_Location *)min_left_local,(bool *)((long)&loc_ref.data + 7),&local_48,&c,&d,
             &stack0xffffffffffffffcc,&local_38);
  bVar1 = Am_Object::operator!=(&local_48,(Am_Object *)loc_local);
  if (bVar1) {
    Am_Translate_Coordinates(&local_48,c,d,(Am_Object *)loc_local,&c,&d);
  }
  if (c < *min_top_local) {
    *min_top_local = c;
  }
  if (d < *_b) {
    *_b = d;
  }
  if ((loc_ref.data._7_1_ & 1) != 0) {
    bVar1 = Am_Object::operator!=(&local_48,(Am_Object *)loc_local);
    if (bVar1) {
      Am_Translate_Coordinates
                (&local_48,iStack_34,local_38,(Am_Object *)loc_local,&stack0xffffffffffffffcc,
                 &local_38);
    }
    if (iStack_34 < *min_top_local) {
      *min_top_local = iStack_34;
    }
    if (local_38 < *_b) {
      *_b = local_38;
    }
  }
  Am_Object::~Am_Object(&local_48);
  return;
}

Assistant:

void
get_min_from_loc(Am_Object &ref_obj, Am_Inter_Location &loc, int &min_left,
                 int &min_top)
{
  int a, b, c, d;
  bool as_line;
  Am_Object loc_ref;
  loc.Get_Location(as_line, loc_ref, a, b, c, d);
  if (loc_ref != ref_obj)
    Am_Translate_Coordinates(loc_ref, a, b, ref_obj, a, b);
  if (a < min_left)
    min_left = a;
  if (b < min_top)
    min_top = b;
  if (as_line) {
    if (loc_ref != ref_obj)
      Am_Translate_Coordinates(loc_ref, c, d, ref_obj, c, d);
    if (c < min_left)
      min_left = c;
    if (d < min_top)
      min_top = d;
  }
}